

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MieInteractionType.hpp
# Opt level: O2

void __thiscall
OpenMD::MieInteractionType::MieInteractionType
          (MieInteractionType *this,RealType mySigma,RealType myEpsilon,int myNrep,int myMatt)

{
  NonBondedInteractionType::NonBondedInteractionType(&this->super_NonBondedInteractionType);
  (this->super_NonBondedInteractionType)._vptr_NonBondedInteractionType =
       (_func_int **)&PTR__NonBondedInteractionType_002c97b8;
  this->sigma = mySigma;
  this->epsilon = myEpsilon;
  this->nRep = myNrep;
  this->mAtt = myMatt;
  NonBondedInteractionType::setMie(&this->super_NonBondedInteractionType);
  return;
}

Assistant:

MieInteractionType(RealType mySigma, RealType myEpsilon, int myNrep,
                       int myMatt) {
      sigma   = mySigma;
      epsilon = myEpsilon;
      nRep    = myNrep;
      mAtt    = myMatt;
      setMie();
    }